

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.h
# Opt level: O0

QString * __thiscall QMakeEvaluator::resolvePath(QMakeEvaluator *this,QString *fileName)

{
  QString *in_RDX;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QString *fileName_00;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fileName_00 = &local_20;
  currentDirectory(in_RDI);
  QMakeInternal::IoUtils::resolvePath(in_RDX,fileName_00);
  QString::~QString((QString *)0x2c84a4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString resolvePath(const QString &fileName) const
        { return QMakeInternal::IoUtils::resolvePath(currentDirectory(), fileName); }